

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O1

void history_buffer_traceback
               (history_buffer *buf,shift_register_t bestpath,uint min_traceback_length,
               bit_writer_t *output)

{
  uint uVar1;
  shift_register_t sVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = buf->cap;
  sVar2 = buf->highbit;
  uVar5 = buf->index;
  uVar6 = (ulong)uVar5;
  if (min_traceback_length != 0) {
    uVar8 = min_traceback_length;
    do {
      uVar5 = (uint)uVar6;
      if ((uint)uVar6 == 0) {
        uVar5 = uVar1;
      }
      uVar5 = uVar5 - 1;
      uVar6 = (ulong)uVar5;
      uVar4 = 0;
      if (buf->history[uVar6][bestpath] != '\0') {
        uVar4 = sVar2;
      }
      bestpath = (uVar4 | bestpath) >> 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  uVar4 = buf->len - min_traceback_length;
  uVar8 = 0;
  if (min_traceback_length <= buf->len && uVar4 != 0) {
    if (uVar5 == 0) {
      uVar5 = uVar1;
    }
    lVar3 = 0;
    do {
      uVar8 = uVar5 - 1;
      uVar5 = uVar8;
      if (uVar8 == 0) {
        uVar5 = uVar1;
      }
      uVar7 = 0;
      if (buf->history[uVar8][bestpath] != '\0') {
        uVar7 = sVar2;
      }
      bestpath = (bestpath | uVar7) >> 1;
      buf->fetched[lVar3] = uVar7 != 0;
      lVar3 = lVar3 + 1;
      uVar8 = uVar4;
    } while (uVar4 != (uint)lVar3);
  }
  bit_writer_write_bitlist_reversed(output,buf->fetched,(ulong)uVar8);
  buf->len = buf->len - uVar8;
  return;
}

Assistant:

void history_buffer_traceback(history_buffer *buf, shift_register_t bestpath,
                              unsigned int min_traceback_length, bit_writer_t *output) {
    unsigned int fetched_index = 0;
    shift_register_t highbit = buf->highbit;
    unsigned int index = buf->index;
    unsigned int cap = buf->cap;
    for (unsigned int j = 0; j < min_traceback_length; j++) {
        if (index == 0) {
            index = cap - 1;
        } else {
            index--;
        }
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
    }
    unsigned int prefetch_index = index;
    if (prefetch_index == 0) {
        prefetch_index = cap - 1;
    } else {
        prefetch_index--;
    }
    unsigned int len = buf->len;
    for (unsigned int j = min_traceback_length; j < len; j++) {
        index = prefetch_index;
        if (prefetch_index == 0) {
            prefetch_index = cap - 1;
        } else {
            prefetch_index--;
        }
        prefetch(buf->history[prefetch_index]);
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
        buf->fetched[fetched_index] = (pathbit ? 1 : 0);
        fetched_index++;
    }
    bit_writer_write_bitlist_reversed(output, buf->fetched, fetched_index);
    buf->len -= fetched_index;
}